

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void free_esni_secret(ptls_esni_secret_t **esni,int is_server)

{
  int in_ESI;
  long *in_RDI;
  
  if (*in_RDI != 0) {
    if (*(long *)*in_RDI != 0) {
      (*ptls_clear_memory)(*(void **)*in_RDI,*(size_t *)(*in_RDI + 8));
      free(*(void **)*in_RDI);
    }
    if (in_ESI == 0) {
      free(*(void **)(*in_RDI + 0x70));
    }
    (*ptls_clear_memory)((void *)*in_RDI,0xd0);
    free((void *)*in_RDI);
    *in_RDI = 0;
    return;
  }
  __assert_fail("*esni != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                ,0x723,"void free_esni_secret(ptls_esni_secret_t **, int)");
}

Assistant:

static void free_esni_secret(ptls_esni_secret_t **esni, int is_server)
{
    assert(*esni != NULL);
    if ((*esni)->secret.base != NULL) {
        ptls_clear_memory((*esni)->secret.base, (*esni)->secret.len);
        free((*esni)->secret.base);
    }
    if (!is_server)
        free((*esni)->client.pubkey.base);
    ptls_clear_memory((*esni), sizeof(**esni));
    free(*esni);
    *esni = NULL;
}